

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_google_units.cpp
# Opt level: O0

void __thiscall googleUnits_unitTypes_Test::TestBody(googleUnits_unitTypes_Test *this)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  Message *pMVar4;
  char *message;
  char *in_R9;
  precise_unit pVar5;
  string local_2f0;
  AssertHelper local_2d0;
  Message local_2c8;
  bool local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_;
  undefined1 local_288 [8];
  precise_unit bunit;
  undefined1 local_270 [8];
  string utype;
  size_type cloc;
  string tp;
  istream local_218 [8];
  ifstream tfile;
  googleUnits_unitTypes_Test *this_local;
  
  std::ifstream::ifstream
            (local_218,
             "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/files/google_defined_units.txt"
             ,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    std::__cxx11::string::string((string *)&cloc);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_218,(string *)&cloc);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      utype.field_2._8_8_ = std::__cxx11::string::find_first_of((char)&cloc,0x3a);
      std::__cxx11::string::substr((ulong)local_270,(ulong)&cloc);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_270,"Misc");
      if (bVar2) {
        bunit.commodity_ = 2;
      }
      else {
        std::__cxx11::string::string((string *)&gtest_ar_.message_,(string *)local_270);
        pVar5 = units::default_unit((string *)&gtest_ar_.message_);
        bunit.multiplier_ = pVar5._8_8_;
        local_288 = (undefined1  [8])pVar5.multiplier_;
        std::__cxx11::string::~string((string *)&gtest_ar_.message_);
        local_2b9 = units::is_valid((precise_unit *)local_288);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
        if (!bVar2) {
          testing::Message::Message(&local_2c8);
          pMVar4 = testing::Message::operator<<
                             (&local_2c8,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_270);
          pMVar4 = testing::Message::operator<<
                             (pMVar4,(char (*) [39])" does not produce a valid default unit");
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_2f0,(internal *)local_2b8,(AssertionResult *)"is_valid(bunit)","false",
                     "true",in_R9);
          message = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_2d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_google_units.cpp"
                     ,0x1f,message);
          testing::internal::AssertHelper::operator=(&local_2d0,pMVar4);
          testing::internal::AssertHelper::~AssertHelper(&local_2d0);
          std::__cxx11::string::~string((string *)&local_2f0);
          testing::Message::~Message(&local_2c8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
        bunit.commodity_ = 0;
      }
      std::__cxx11::string::~string((string *)local_270);
    }
    std::__cxx11::string::~string((string *)&cloc);
  }
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

TEST(googleUnits, unitTypes)
{
    std::ifstream tfile(TEST_FILE_FOLDER "/google_defined_units.txt");
    if (tfile.is_open()) {  // checking whether the file is open
        std::string tp;
        while (std::getline(tfile, tp)) {  // read data from file object and put
                                           // it into string.
            auto cloc = tp.find_first_of(':');
            std::string utype = tp.substr(0, cloc);
            if (utype == "Misc") {
                continue;
            }
            auto bunit = units::default_unit(utype);
            EXPECT_TRUE(is_valid(bunit))
                << utype << " does not produce a valid default unit";
        }
    }
}